

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  element_type *peVar1;
  string *in_RDI;
  shared_ptr<Catch::TestCaseTracking::SectionTracker> *in_stack_ffffffffffffff48;
  SourceLineInfo *this_00;
  NameAndLocation *this_01;
  void **in_stack_ffffffffffffff78;
  TrackerContext *in_stack_ffffffffffffff80;
  NameAndLocation *in_stack_ffffffffffffff88;
  undefined1 local_69 [105];
  
  this_01 = (NameAndLocation *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_69 + 1),"{root}",(allocator *)this_01);
  this_00 = (SourceLineInfo *)&stack0xffffffffffffff70;
  SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/../third_party/catch/catch.hpp"
             ,0x389e);
  NameAndLocation::NameAndLocation(this_01,in_RDI,this_00);
  std::
  make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::shared_ptr<Catch::TestCaseTracking::ITracker>::operator=
            ((shared_ptr<Catch::TestCaseTracking::ITracker> *)this_00,in_stack_ffffffffffffff48);
  clara::std::shared_ptr<Catch::TestCaseTracking::SectionTracker>::~shared_ptr
            ((shared_ptr<Catch::TestCaseTracking::SectionTracker> *)0x26854a);
  NameAndLocation::~NameAndLocation((NameAndLocation *)0x268554);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  (in_RDI->field_2)._M_allocated_capacity = 0;
  *(undefined4 *)((long)&in_RDI->field_2 + 8) = 1;
  peVar1 = clara::std::
           __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this_00);
  return peVar1;
}

Assistant:

ITracker& TrackerContext::startRun() {
        m_rootTracker = std::make_shared<SectionTracker>( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }